

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O0

int sas_client_session_state_machine
              (sas_client *client,sas_transport_packet_header *header,size_t count)

{
  uint8_t uVar1;
  int iVar2;
  sas_transport_packet_header *packet_00;
  rxc_source *prVar3;
  rxc_pipeline *prVar4;
  undefined8 uVar5;
  uint local_58;
  rxc_source *source;
  int err_1;
  sas_transport_packet_cfg_ack *cfg;
  sas_transport_packet_err *packet;
  int err;
  size_t count_local;
  sas_transport_packet_header *header_local;
  sas_client *client_local;
  
  if (header->seq < (client->session).ack) {
    sas_log("[DEBUG] Dropping packet\n");
    client_local._4_4_ = 0;
  }
  else {
    if ((client->session).ack < header->seq) {
      sas_log("[DEBUG] Out-of-order packet\n");
    }
    (client->session).send_window = header->window;
    if (header->length == 0) {
      local_58 = 1;
    }
    else {
      local_58 = (uint)header->length;
    }
    (client->session).ack = header->seq + local_58;
    if ((header->flags & 4) == 4) {
      packet._4_4_ = 0x68;
      if ((header->flags & 0x10) == 0x10) {
        sas_transport_packet_err_decode((sas_transport_packet_err *)(header + 1));
        packet._4_4_ = header[1].seq;
      }
      else if ((header->flags & 1) == 1) {
        packet._4_4_ = 0;
        (client->session).state = '\x05';
      }
      client_local._4_4_ = packet._4_4_;
    }
    else {
      uVar1 = (client->session).state;
      if (uVar1 == '\x02') {
        packet_00 = header + 1;
        sas_transport_packet_cfg_ack_decode((sas_transport_packet_cfg_ack *)packet_00);
        (client->session).chunk.dealloc = chunk_dealloc;
        (client->session).chunk.sample_rate = packet_00->seq;
        (client->session).chunk.sample_size = (int8_t)header[1].ack;
        (client->session).chunk.channels = *(int8_t *)((long)&header[1].ack + 1);
        (client->session).chunk.codec = *(uint8_t *)((long)&header[1].ack + 2);
        (client->session).chunk.size = (ulong)header->length - 8;
        (client->session).chunk.buffer = header[1].reserved;
        sas_log("[INFO] %d %d %d\n",(ulong)packet_00->seq,(ulong)(uint)(int)(char)header[1].ack,
                (ulong)(uint)(int)*(char *)((long)&header[1].ack + 1));
        prVar3 = sas_client_session_source(client);
        prVar4 = (rxc_pipeline *)rxc_source_to(prVar3,client->sink);
        (client->session).pipeline = prVar4;
        prVar4 = (client->session).pipeline;
        uVar5 = rxc_scheduler_trampoline();
        iVar2 = rxc_pipeline_start(prVar4,uVar5);
        if (iVar2 != 0) {
          return -1;
        }
        sas_client_session_ack(client);
        (client->session).state = '\x04';
        (*((client->session).sink_logic)->on_push)
                  ((client->session).sink_logic,&(client->session).chunk);
      }
      else if (uVar1 == '\x04') {
        (client->session).chunk.size = (ulong)header->length - 8;
        (client->session).chunk.buffer = (uint8_t *)(header + 1);
        (*((client->session).sink_logic)->on_push)
                  ((client->session).sink_logic,&(client->session).chunk);
        (client->session).receive_window = 0;
        sas_client_session_ack(client);
      }
      else {
        sas_log("[WARN] Unexpected state %d in state machine\n",(ulong)(client->session).state);
      }
      client_local._4_4_ = 0;
    }
  }
  return client_local._4_4_;
}

Assistant:

int sas_client_session_state_machine(struct sas_client *client,
                                     struct sas_transport_packet_header *header,
                                     size_t count)
{

    /* Validate packet */
    if (header->seq < client->session.ack) {
        /* At this point we are receiving a packet we have already ack'ed.
         * Thus, we drop the packet */
        sas_log(LOG_DEBUG "Dropping packet\n");
        return 0;
    } else if (header->seq > client->session.ack) {
        /* The packet is out-of-order. In the future, we could reorder them,
         * for now, we just process it */
        sas_log(LOG_DEBUG "Out-of-order packet\n");
    }

    /* Update send window */
    client->session.send_window = header->window;

    /* Ack this packet */
    client->session.ack = header->seq + (header->length > 0 ? header->length : 1);

    /* Forget the session on reset */
    if (sas_transport_packet_flag_isset(header->flags, SAS_TRANSPORT_PACKET_FLAG_RST)) {
        int err = ECONNRESET;

        if (sas_transport_packet_flag_isset(header->flags, SAS_TRANSPORT_PACKET_FLAG_ERR)) {
            /* An error occurred */
            struct sas_transport_packet_err *packet = (void *) &header[1];
            sas_transport_packet_err_decode(packet);
            err = packet->err;
        } else if (sas_transport_packet_flag_isset(header->flags, SAS_TRANSPORT_PACKET_FLAG_FIN)) {
            /* Stream finished successfully */
            err = 0;
            client->session.state = SAS_TRANSPORT_STATE_FINISHED;
        }

        return err;
    }

    switch (client->session.state) {
        case SAS_TRANSPORT_STATE_SYN_SENT: {
            struct sas_transport_packet_cfg_ack *cfg = (void *) &header[1];
            sas_transport_packet_cfg_ack_decode(cfg);

            client->session.chunk.dealloc = chunk_dealloc;
            client->session.chunk.sample_rate = cfg->sample_rate;
            client->session.chunk.sample_size = cfg->sample_size;
            client->session.chunk.channels = cfg->channels;
            client->session.chunk.codec = cfg->codec;
            client->session.chunk.size = header->length - sizeof(struct sas_transport_packet_cfg_ack);
            client->session.chunk.buffer = (void *) &cfg[1];

            sas_log(LOG_INFO "%d %d %d\n", cfg->sample_rate, cfg->sample_size, cfg->channels);

            /* Setup the streaming pipeline */
            int err;
            struct rxc_source *source = sas_client_session_source(client);
            client->session.pipeline = rxc_source_to(source, client->sink);

            if ((err = rxc_pipeline_start(client->session.pipeline, rxc_scheduler_trampoline())) != 0) {
                return -1;
            }

            sas_client_session_ack(client);
            client->session.state = SAS_TRANSPORT_STATE_ESTABLSH;

            /* Push configuration to sink */
            client->session.sink_logic->on_push(client->session.sink_logic, &client->session.chunk);
            break;
        }
        case SAS_TRANSPORT_STATE_ESTABLSH: {
            /* Push chunk to sink */
            client->session.chunk.size = header->length - sizeof(struct sas_transport_packet_cfg_ack);
            client->session.chunk.buffer = (void *) &header[1];
            client->session.sink_logic->on_push(client->session.sink_logic, &client->session.chunk);
            client->session.receive_window = 0;

            sas_client_session_ack(client);
            break;
        }
        default:
            sas_log(LOG_WARN "Unexpected state %d in state machine\n", client->session.state);
    }

    return 0;
}